

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_cache.c
# Opt level: O2

ent * get_ent(state *s,int i)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  ent *peVar4;
  
  iVar3 = (s->cache).i0;
  if (i < iVar3) {
    return (ent *)0x0;
  }
  iVar1 = (s->cache).i1;
  if (iVar1 < i) {
LAB_00102f7f:
    peVar4 = (ent *)0x0;
  }
  else {
    if (iVar1 == i) {
      _Var2 = (*(s->op).parse)(s);
      if (!_Var2) goto LAB_00102f7f;
      iVar3 = (s->cache).i0;
    }
    peVar4 = (s->cache).ent + ((i - iVar3) + (s->cache).k) % 0x1000;
  }
  return peVar4;
}

Assistant:

struct ent *
get_ent(struct state *s, int i)
{
	struct cache *c = &s->cache;

	if (i < c->i0 || i > c->i1)
		return NULL;

	if (i == c->i1 && !s->op.parse(s))
		return NULL;

	return CACHE_ENT(s, i);
}